

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageAndPreserveBufferTest::iterate
          (SwapBuffersWithDamageAndPreserveBufferTest *this)

{
  NativeWindow *pNVar1;
  EGLDisplay pvVar2;
  EGLSurface pvVar3;
  EGLint width_00;
  EGLint height_00;
  deUint32 dVar4;
  deBool dVar5;
  Library *egl_00;
  reference pvVar6;
  float x_;
  Vector<int,_2> local_c0;
  Vector<int,_2> local_b8;
  Vector<int,_2> local_b0;
  Vector<int,_2> local_a8;
  undefined1 local_a0 [8];
  vector<int,_std::allocator<int>_> damageRegion;
  Frame *currentFrame;
  int frameNdx;
  int iterationNdx;
  FrameSequence frameSequence;
  undefined1 local_58 [4];
  int numFrames;
  Vec4 clearColor;
  float clearBlue;
  float clearGreen;
  float clearRed;
  int height;
  int width;
  Library *egl;
  Random rnd;
  SwapBuffersWithDamageAndPreserveBufferTest *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)&egl,(this->super_SwapBuffersWithDamageTest).m_seed);
  egl_00 = EglTestContext::getLibrary
                     ((this->super_SwapBuffersWithDamageTest).super_TestCase.m_eglTestCtx);
  width_00 = eglu::querySurfaceInt
                       (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                        (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3057);
  height_00 = eglu::querySurfaceInt
                        (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                         (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3056);
  x_ = de::Random::getFloat((Random *)&egl);
  clearColor.m_data[3] = de::Random::getFloat((Random *)&egl);
  clearColor.m_data[2] = de::Random::getFloat((Random *)&egl);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_58,x_,clearColor.m_data[3],clearColor.m_data[2],1.0);
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x18;
  generateFrameSequence
            ((FrameSequence *)&frameNdx,&(this->super_SwapBuffersWithDamageTest).m_frameDrawType,
             (Random *)&egl,0x18,width_00,height_00);
  tcu::TestContext::setTestResult
            ((this->super_SwapBuffersWithDamageTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  do {
    (*egl_00->_vptr_Library[0x30])
              (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
               (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3093,0x3094);
    dVar4 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar4,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                     ,0x1eb);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  for (currentFrame._4_4_ = 0;
      currentFrame._4_4_ < (this->super_SwapBuffersWithDamageTest).m_iterationTimes;
      currentFrame._4_4_ = currentFrame._4_4_ + 1) {
    clearColorScreen(&(this->super_SwapBuffersWithDamageTest).m_gl,(Vec4 *)local_58);
    do {
      (*egl_00->_vptr_Library[0x32])
                (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                 (this->super_SwapBuffersWithDamageTest).m_eglSurface,0);
      dVar4 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar4,"swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                       ,0x1f0);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    for (currentFrame._0_4_ = 0; (int)currentFrame < 0x18;
        currentFrame._0_4_ = (int)currentFrame + 1) {
      damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           &std::
            vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
            ::operator[]((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
                          *)&frameNdx,(long)(int)currentFrame)->width;
      getDamageRegion((vector<int,_std::allocator<int>_> *)local_a0,
                      (Frame *)damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
      GLES2Renderer::render
                ((this->super_SwapBuffersWithDamageTest).m_gles2Renderer,width_00,height_00,
                 (Frame *)damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      if ((this->super_SwapBuffersWithDamageTest).m_resizeType == RESIZETYPE_BEFORE_SWAP) {
        if (currentFrame._4_4_ % 2 == 0) {
          pNVar1 = (this->super_SwapBuffersWithDamageTest).m_window;
          tcu::Vector<int,_2>::Vector(&local_a8,width_00 * 2,height_00 / 2);
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_a8);
        }
        else {
          pNVar1 = (this->super_SwapBuffersWithDamageTest).m_window;
          tcu::Vector<int,_2>::Vector(&local_b0,height_00 / 2,width_00 * 2);
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_b0);
        }
      }
      do {
        pvVar2 = (this->super_SwapBuffersWithDamageTest).m_eglDisplay;
        pvVar3 = (this->super_SwapBuffersWithDamageTest).m_eglSurface;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_a0,0);
        std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)local_a0);
        (*egl_00->_vptr_Library[0x32])(egl_00,pvVar2,pvVar3,pvVar6);
        dVar4 = (*egl_00->_vptr_Library[0x1f])();
        eglu::checkError(dVar4,
                         "swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                         ,0x201);
        dVar5 = ::deGetFalse();
      } while (dVar5 != 0);
      if ((this->super_SwapBuffersWithDamageTest).m_resizeType == RESIZETYPE_AFTER_SWAP) {
        if (currentFrame._4_4_ % 2 == 0) {
          pNVar1 = (this->super_SwapBuffersWithDamageTest).m_window;
          tcu::Vector<int,_2>::Vector(&local_b8,width_00 * 2,height_00 / 2);
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_b8);
        }
        else {
          pNVar1 = (this->super_SwapBuffersWithDamageTest).m_window;
          tcu::Vector<int,_2>::Vector(&local_c0,height_00 / 2,width_00 * 2);
          (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&local_c0);
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a0)
      ;
    }
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             *)&frameNdx);
  de::Random::~Random((Random *)&egl);
  return STOP;
}

Assistant:

TestCase::IterateResult SwapBuffersWithDamageAndPreserveBufferTest::iterate (void)
{

	de::Random			rnd				(m_seed);
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const int			width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int			height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float			clearRed		= rnd.getFloat();
	const float			clearGreen		= rnd.getFloat();
	const float			clearBlue		= rnd.getFloat();
	const tcu::Vec4		clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int			numFrames		= 24; // (width, height) = (480, 480) --> numFrame = 24, divisible
	const FrameSequence frameSequence	= generateFrameSequence(m_frameDrawType, rnd, numFrames, width, height);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_PRESERVED));

	for (int iterationNdx = 0; iterationNdx < m_iterationTimes; iterationNdx++)
	{
		clearColorScreen(m_gl, clearColor);
		EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0));

		for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
		{
			const Frame&	currentFrame = frameSequence[frameNdx];
			vector<EGLint>	damageRegion = getDamageRegion(currentFrame);

			m_gles2Renderer->render(width, height, currentFrame);

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}
		}
	}

	return STOP;
}